

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O0

void parse_opt_arg(pExecutor exec,Expr expr,Expr *arg,Expr *def)

{
  undefined4 uVar1;
  Expr *__ptr;
  Expr expr_00;
  Expr *list;
  Expr *pEStack_30;
  int len;
  Expr *def_local;
  Expr *arg_local;
  pExecutor exec_local;
  Expr expr_local;
  
  expr_00.field_1 = expr.field_1;
  expr_00.type = expr.type;
  if (expr_00.type == VT_ATOM) {
    *(ulong *)arg = CONCAT44(exec_local._4_4_,1);
    (arg->field_1).val_atom = (size_t)expr_00.field_1;
    uVar1 = *(undefined4 *)&(exec->nil).field_0x4;
    def->type = (exec->nil).type;
    *(undefined4 *)&def->field_0x4 = uVar1;
    def->field_1 = (exec->nil).field_1;
  }
  else {
    expr_00._4_4_ = 0;
    pEStack_30 = def;
    def_local = arg;
    arg_local = (Expr *)exec;
    exec_local._0_4_ = expr_00.type;
    expr_local._0_8_ = expr_00.field_1.val_atom;
    __ptr = get_list(exec,expr_00,(int *)((long)&list + 4));
    uVar1 = *(undefined4 *)&__ptr->field_0x4;
    def_local->type = __ptr->type;
    *(undefined4 *)&def_local->field_0x4 = uVar1;
    def_local->field_1 = __ptr->field_1;
    uVar1 = *(undefined4 *)&__ptr[1].field_0x4;
    pEStack_30->type = __ptr[1].type;
    *(undefined4 *)&pEStack_30->field_0x4 = uVar1;
    pEStack_30->field_1 = __ptr[1].field_1;
    free(__ptr);
  }
  return;
}

Assistant:

void parse_opt_arg(pExecutor exec, Expr expr, Expr *arg, Expr *def)
{
    if (expr.type == VT_ATOM)
    {
        *arg = expr;
        *def = exec->nil;
    }
    else // VT_PAIR
    {
        int len;
        Expr *list = get_list(exec, expr, &len);
        *arg = list[0];
        *def = list[1];
        free(list);
    }
}